

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O2

void __thiscall CLIListener::do_discover(CLIListener *this,Poll *p)

{
  uint64_t cmd_seq;
  undefined8 uVar1;
  shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> query;
  type unblock;
  string empty;
  Simple dto;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  reference_wrapper<Poll> local_128;
  undefined1 local_120 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  OnTimeout local_108;
  OnError local_e8;
  OnResponse local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [56];
  _Bind<void_(CLIListener::*(CLIListener_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(dto::Complex_&,_sockaddr_in)>
  local_30;
  
  block_input(this,p);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  cmd_seq = this->cmd_seq;
  this->cmd_seq = cmd_seq + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"HELLO",(allocator<char> *)local_138);
  ::dto::create((Simple *)local_68,cmd_seq,&local_a8,&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  local_138._0_4_ = this->timeout_sec * 1000;
  std::
  make_shared<MultiQuery<dto::Simple,dto::Complex>,dto::Simple&,unsigned_short&,std::__cxx11::string&,int>
            ((Simple *)local_148,(unsigned_short *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->port,
             (int *)&this->mcast_addr);
  std::__shared_ptr<Subscriber,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<MultiQuery<dto::Simple,dto::Complex>,void>
            ((__shared_ptr<Subscriber,(__gnu_cxx::_Lock_policy)2> *)(local_120 + 8),
             (__shared_ptr<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2> *)
             local_148);
  Poll::subscribe(p,(shared_ptr<Subscriber> *)(local_120 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
  uVar1 = local_148._0_8_;
  local_138._0_8_ = unblock_input;
  local_138._8_8_ = (pointer)0x0;
  local_30._M_f = (offset_in_CLIListener_to_subr)on_discover_result;
  local_30._8_8_ = 0;
  local_128._M_data = p;
  local_120._0_8_ = this;
  local_30._M_bound_args.
  super__Tuple_impl<0UL,_CLIListener_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_CLIListener_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_CLIListener_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       (_Tuple_impl<0UL,_CLIListener_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
  std::function<void(dto::Complex&,sockaddr_in)>::
  function<std::_Bind<void(CLIListener::*(CLIListener*,std::_Placeholder<1>,std::_Placeholder<2>))(dto::Complex&,sockaddr_in)>,void>
            ((function<void(dto::Complex&,sockaddr_in)> *)&local_c8,&local_30);
  MultiQuery<dto::Simple,_dto::Complex>::when_response
            ((MultiQuery<dto::Simple,_dto::Complex> *)uVar1,&local_c8);
  std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  uVar1 = local_148._0_8_;
  std::function<void()>::
  function<std::_Bind<void(CLIListener::*(CLIListener*,std::reference_wrapper<Poll>))(Poll&)>&,void>
            ((function<void()> *)&local_e8,
             (_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>))(Poll_&)> *)
             local_138);
  MultiQuery<dto::Simple,_dto::Complex>::when_error
            ((MultiQuery<dto::Simple,_dto::Complex> *)uVar1,&local_e8);
  std::_Function_base::~_Function_base(&local_e8.super__Function_base);
  std::function<void()>::
  function<std::_Bind<void(CLIListener::*(CLIListener*,std::reference_wrapper<Poll>))(Poll&)>&,void>
            ((function<void()> *)&local_108,
             (_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>))(Poll_&)> *)
             local_138);
  MultiQuery<dto::Simple,_dto::Complex>::when_timeout
            ((MultiQuery<dto::Simple,_dto::Complex> *)local_148._0_8_,&local_108);
  std::_Function_base::~_Function_base(&local_108.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  std::__cxx11::string::~string((string *)(local_68 + 0x18));
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void CLIListener::do_discover(Poll &p) {
  block_input(p);
  auto empty = std::string();
  auto dto = dto::create(cmd_seq++, "HELLO", empty);
  auto query = std::make_shared<MultiQuery<dto::Simple, dto::Complex>>(dto, port, mcast_addr, timeout_sec * 1000);
  p.subscribe(query);
  auto unblock = std::bind(&CLIListener::unblock_input, this, std::ref(p));
  query->when_response(std::bind(&CLIListener::on_discover_result, this, _1, _2));
  query->when_error(unblock);
  query->when_timeout(unblock);
}